

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertBitsEqual
          (UtestShell *this,unsigned_long expected,unsigned_long actual,unsigned_long mask,
          size_t byteCount,char *text,char *fileName,size_t lineNumber,
          TestTerminator *testTerminator)

{
  char *byteCount_00;
  size_t mask_00;
  unsigned_long actual_00;
  unsigned_long expected_00;
  TestResult *pTVar1;
  SimpleString local_b0;
  BitsEqualFailure local_a0;
  char *local_38;
  char *text_local;
  size_t byteCount_local;
  unsigned_long mask_local;
  unsigned_long actual_local;
  unsigned_long expected_local;
  UtestShell *this_local;
  
  local_38 = text;
  text_local = (char *)byteCount;
  byteCount_local = mask;
  mask_local = actual;
  actual_local = expected;
  expected_local = (unsigned_long)this;
  pTVar1 = getTestResult(this);
  (*pTVar1->_vptr_TestResult[10])();
  expected_00 = actual_local;
  actual_00 = mask_local;
  mask_00 = byteCount_local;
  byteCount_00 = text_local;
  if ((actual_local & byteCount_local) != (mask_local & byteCount_local)) {
    SimpleString::SimpleString(&local_b0,local_38);
    BitsEqualFailure::BitsEqualFailure
              (&local_a0,this,fileName,lineNumber,expected_00,actual_00,mask_00,(size_t)byteCount_00
               ,&local_b0);
    (*this->_vptr_UtestShell[0x27])(this,&local_a0,testTerminator);
    BitsEqualFailure::~BitsEqualFailure(&local_a0);
    SimpleString::~SimpleString(&local_b0);
  }
  return;
}

Assistant:

void UtestShell::assertBitsEqual(unsigned long expected, unsigned long actual, unsigned long mask, size_t byteCount, const char* text, const char *fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if ((expected & mask) != (actual & mask))
        failWith(BitsEqualFailure(this, fileName, lineNumber, expected, actual, mask, byteCount, text), testTerminator);
}